

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

FILE * __thiscall phosg::fopen_binary_raw(phosg *this,string *filename,string *mode)

{
  void *pvVar1;
  FILE *pFVar2;
  cannot_open_file *this_00;
  _Alloc_hider __modes;
  string new_mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,filename,
             (long)&(mode->_M_dataplus)._M_p + (long)&(filename->_M_dataplus)._M_p);
  __modes._M_p = local_38._M_dataplus._M_p;
  if (local_38._M_string_length != 0) {
    pvVar1 = memchr(local_38._M_dataplus._M_p,0x62,local_38._M_string_length);
    if (pvVar1 != (void *)0x0 && (long)pvVar1 - (long)__modes._M_p != -1) goto LAB_00109add;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_38,'b');
  __modes._M_p = local_38._M_dataplus._M_p;
LAB_00109add:
  pFVar2 = fopen(*(char **)this,__modes._M_p);
  if (pFVar2 != (FILE *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return (FILE *)pFVar2;
  }
  this_00 = (cannot_open_file *)__cxa_allocate_exception(0x20);
  cannot_open_file::cannot_open_file(this_00,(string *)this);
  __cxa_throw(this_00,&cannot_open_file::typeinfo,cannot_open_file::~cannot_open_file);
}

Assistant:

static FILE* fopen_binary_raw(const string& filename, const string& mode) {
  string new_mode = mode;
  if (new_mode.find('b') == string::npos) {
    new_mode += 'b';
  }
  FILE* f = fopen(filename.c_str(), new_mode.c_str());
  if (!f) {
    throw cannot_open_file(filename);
  }
  return f;
}